

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere.h
# Opt level: O3

bool __thiscall Sphere::intersect(Sphere *this,Ray *ray,Hit *h,float tmin)

{
  ulong uVar1;
  undefined8 uVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  byte bVar5;
  long lVar6;
  float *pfVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  undefined4 in_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  float __tmp;
  float fVar14;
  float s [2];
  Vector3f norm;
  Vector3f p;
  float local_90 [2];
  undefined1 local_88 [16];
  Vector3f local_74;
  float local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  Vector3f local_54;
  Vector3f local_48;
  Vector3f local_3c;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  local_68 = tmin;
  uStack_64 = in_XMM0_Db;
  uStack_60 = in_XMM0_Dc;
  uStack_5c = in_XMM0_Dd;
  operator-(&ray->o,&this->o);
  auVar12._0_4_ = Vector3f::squaredLength(&local_3c);
  auVar12._4_60_ = extraout_var;
  auVar9 = vfnmadd213ss_fma(ZEXT416((uint)this->r),ZEXT416((uint)this->r),auVar12._0_16_);
  fVar10 = Vector3f::dot(&local_3c,&ray->d);
  local_88 = ZEXT416((uint)(fVar10 + fVar10));
  fVar10 = Vector3f::squaredLength(&ray->d);
  auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 * -4.0 * auVar9._0_4_)),local_88,local_88);
  fVar11 = auVar9._0_4_;
  if (0.0 <= fVar11) {
    if (fVar11 < 0.0) {
      fVar11 = sqrtf(fVar11);
    }
    else {
      auVar9 = vsqrtss_avx(auVar9,auVar9);
      fVar11 = auVar9._0_4_;
    }
    auVar9._8_4_ = 0x80000000;
    auVar9._0_8_ = 0x8000000080000000;
    auVar9._12_4_ = 0x80000000;
    auVar9 = vxorps_avx512vl(local_88,auVar9);
    fVar14 = (auVar9._0_4_ - fVar11) / (fVar10 + fVar10);
    local_90[1] = (fVar11 - local_88._0_4_) / (fVar10 + fVar10);
    local_90[0] = fVar14;
    if (local_90[1] < fVar14) {
      local_90[0] = local_90[1];
      local_90[1] = fVar14;
    }
    auVar4._4_4_ = uStack_64;
    auVar4._0_4_ = local_68;
    auVar4._8_4_ = uStack_60;
    auVar4._12_4_ = uStack_5c;
    lVar6 = 0;
    do {
      fVar10 = *(float *)((long)local_90 + lVar6);
      uVar8 = vcmpps_avx512vl(ZEXT416((uint)fVar10),auVar4,5);
      uVar1 = vcmpps_avx512vl(ZEXT416((uint)h->t),ZEXT416((uint)fVar10),6);
      uVar8 = uVar8 & uVar1;
      if ((uVar8 & 1) != 0) {
        local_88._0_2_ = (short)uVar8;
        ::operator*(&local_54,fVar10);
        operator+(&ray->o,&local_54);
        operator-(&local_74,&this->o);
        Vector3f::normalize(&local_48);
        h->t = fVar10;
        h->obj = &this->super_Object;
        Vector3f::operator=(&h->norm,&local_48);
        pfVar7 = Vector3f::operator[](&local_48,2);
        fVar10 = *pfVar7;
        pfVar7 = Vector3f::operator[](&local_48,0);
        auVar13._0_4_ = atan2f(fVar10,*pfVar7);
        auVar13._4_60_ = extraout_var_00;
        uVar2 = vcmpss_avx512f(auVar13._0_16_,ZEXT816(0) << 0x40,1);
        bVar3 = (bool)((byte)uVar2 & 1);
        pfVar7 = Vector3f::operator[](&local_48,1);
        Vector2f::Vector2f((Vector2f *)&local_74,(1.0 - *pfVar7) * 0.5,
                           (float)((uint)bVar3 * (int)(auVar13._0_4_ + 6.2831855) +
                                  (uint)!bVar3 * (int)auVar13._0_4_) / 6.2831855);
        Vector2f::operator=(&h->pos,(Vector2f *)&local_74);
        uVar8 = (ulong)(ushort)local_88._0_2_;
        break;
      }
      lVar6 = lVar6 + 4;
    } while (lVar6 != 8);
    bVar5 = (byte)uVar8;
  }
  else {
    bVar5 = 0;
  }
  return (bool)(bVar5 & 1);
}

Assistant:

bool intersect(const Ray& ray, Hit& h, float tmin) override {
		Vector3f p = ray.o - o;
		float C = p.squaredLength() - r * r;
		float B = 2 * Vector3f::dot(p, ray.d);
		float A = ray.d.squaredLength();
		float dt = B * B - 4 * A * C;
		if (dt < 0) return 0;
		dt = sqrt(dt);
		float s[2] = { (-B - dt) / (2 * A),(-B + dt) / (2 * A) };
		if (s[0] > s[1]) std::swap(s[0], s[1]);
		for (float t : s)
		{
			if (t < tmin || t >= h.t) continue;
			Vector3f norm = ray.o + ray.d * t - o;
			norm.normalize();
			h.t = t; h.obj = this; h.norm = norm;
			float u = atan2f(norm[2], norm[0]);
			if (u < 0) u += PI * 2;
			h.pos = Vector2f((-norm[1] + 1) / 2, u / (PI * 2));
			return 1;
		}
		return 0;
	}